

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.c
# Opt level: O0

effect_index effect_lookup(char *name)

{
  int iVar1;
  char *effect_name;
  size_t i;
  char *name_local;
  
  effect_name = (char *)0x0;
  while( true ) {
    if ((char *)0x7f < effect_name) {
      return EF_MAX;
    }
    if ((effect_names[(long)effect_name] != (char *)0x0) &&
       (iVar1 = strcmp(name,effect_names[(long)effect_name]), iVar1 == 0)) break;
    effect_name = effect_name + 1;
  }
  return (effect_index)effect_name;
}

Assistant:

effect_index effect_lookup(const char *name)
{
	size_t i;

	for (i = 0; i < N_ELEMENTS(effect_names); i++) {
		const char *effect_name = effect_names[i];

		/* Test for equality */
		if (effect_name != NULL && streq(name, effect_name))
			return i;
	}

	return EF_MAX;
}